

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  pointer data;
  bool bVar1;
  LogMessage *other;
  byte *pbVar2;
  ulong uVar3;
  uint uVar4;
  int size;
  ulong uVar5;
  uint uVar6;
  byte *ptr;
  size_t __n;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar6 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  output->cur_ = pbVar2;
  *pbVar2 = (byte)uVar6 | 2;
  if (uVar6 < 0x80) {
    ptr = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar6 | 0x82;
    pbVar2[1] = (byte)(uVar6 >> 7);
    ptr = pbVar2 + 2;
    if (0x3fff < uVar6) {
      uVar4 = (uint)pbVar2[1];
      uVar6 = uVar6 >> 7;
      do {
        ptr[-1] = (byte)uVar4 | 0x80;
        uVar4 = uVar6 >> 7;
        *ptr = (byte)uVar4;
        ptr = ptr + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar1);
    }
  }
  output->cur_ = ptr;
  uVar5 = value->_M_string_length;
  if ((uVar5 & 0xffffffff80000000) != 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format_lite.cc"
               ,0x1f5);
    other = LogMessage::operator<<(&local_60,"CHECK failed: (value.size()) <= (kInt32MaxSize): ");
    LogFinisher::operator=(&local_61,other);
    LogMessage::~LogMessage(&local_60);
    uVar5 = value->_M_string_length;
    ptr = output->cur_;
  }
  if ((output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
  }
  output->cur_ = ptr;
  *ptr = (byte)uVar5;
  if ((uint)uVar5 < 0x80) {
    pbVar2 = ptr + 1;
  }
  else {
    *ptr = (byte)uVar5 | 0x80;
    uVar3 = uVar5 >> 7 & 0x1ffffff;
    ptr[1] = (byte)uVar3;
    pbVar2 = ptr + 2;
    if (0x3fff < (uint)uVar5) {
      uVar5 = (ulong)ptr[1];
      do {
        pbVar2[-1] = (byte)uVar5 | 0x80;
        uVar5 = uVar3 >> 7;
        *pbVar2 = (byte)uVar5;
        pbVar2 = pbVar2 + 1;
        uVar6 = (uint)uVar3;
        uVar3 = uVar5;
      } while (0x3fff < uVar6);
    }
  }
  output->cur_ = pbVar2;
  data = (value->_M_dataplus)._M_p;
  size = (int)value->_M_string_length;
  __n = (size_t)size;
  if ((long)(output->impl_).end_ - (long)pbVar2 < (long)__n) {
    pbVar2 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,data,size,pbVar2);
  }
  else {
    memcpy(pbVar2,data,__n);
    pbVar2 = pbVar2 + __n;
  }
  output->cur_ = pbVar2;
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const std::string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  GOOGLE_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}